

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int ncnn::reduction<std::plus<float>,std::plus<float>,ncnn::post_process_identity<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,bool post_process,
              float coeff,int keepdims,Option *opt)

{
  int iVar1;
  int iVar2;
  Mat *pMVar3;
  
  pMVar3 = b;
  if (keepdims == 0) {
    iVar1 = reduction_op<std::plus<float>,std::plus<float>>(a,b,v0,reduce_w,reduce_h,reduce_c,opt);
  }
  else {
    iVar1 = reduction_op_keepdims<std::plus<float>,std::plus<float>>
                      (a,b,v0,reduce_w,reduce_h,reduce_c,opt);
  }
  iVar2 = -100;
  if ((iVar1 == 0) && ((post_process || (iVar2 = 0, 1.1920929e-07 < ABS(v0 + -1.0))))) {
    reduction_post_process<ncnn::post_process_identity<float>>(b,v0,(Option *)pMVar3);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int reduction(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, bool post_process, float coeff, int keepdims, const Option& opt)
{
    int ret;
    if (keepdims)
        ret = reduction_op_keepdims<Op, Op2>(a, b, v0, reduce_w, reduce_h, reduce_c, opt);
    else
        ret = reduction_op<Op, Op2>(a, b, v0, reduce_w, reduce_h, reduce_c, opt);
    if (ret != 0)
        return -100;

    if (post_process || fabs(coeff - 1.f) > FLT_EPSILON)
    {
        ret = reduction_post_process<Op3>(b, coeff, opt);
        if (ret != 0)
            return -100;
    }
    return ret;
}